

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O0

TreeNode * si9ma::BinaryTree::get_pre(TreeNode *head)

{
  bool bVar1;
  TreeNode *local_28;
  TreeNode *parent;
  TreeNode *cur;
  TreeNode *head_local;
  
  if (head == (TreeNode *)0x0) {
    head_local = (TreeNode *)0x0;
  }
  else if (head->left == (TreeNode *)0x0) {
    local_28 = head->parent;
    parent = head;
    while( true ) {
      bVar1 = false;
      if (local_28 != (TreeNode *)0x0) {
        bVar1 = local_28->right != parent;
      }
      if (!bVar1) break;
      parent = local_28;
      local_28 = local_28->parent;
    }
    head_local = local_28;
  }
  else {
    head_local = get_right_most(head->left);
  }
  return head_local;
}

Assistant:

const TreeNode* BinaryTree::get_pre(const TreeNode *head) {
        if (head == nullptr)
            return head;

        if (head->left != nullptr)
            return get_right_most(head->left);
        else{
            auto *cur = head;
            auto *parent = head->parent;

            while (parent != nullptr && parent->right != cur){
                cur = parent;
                parent = parent->parent;
            }

            return parent;
        }
    }